

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void Json::fixNumericLocaleInput(char *begin,char *end)

{
  char cVar1;
  char decimalPoint;
  char *end_local;
  char *begin_local;
  
  cVar1 = getDecimalPoint();
  if ((cVar1 != '\0') && (end_local = begin, cVar1 != '.')) {
    for (; end_local < end; end_local = end_local + 1) {
      if (*end_local == '.') {
        *end_local = cVar1;
      }
    }
  }
  return;
}

Assistant:

static inline void fixNumericLocaleInput(char* begin, char* end) {
  char decimalPoint = getDecimalPoint();
  if (decimalPoint != '\0' && decimalPoint != '.') {
    while (begin < end) {
      if (*begin == '.') {
        *begin = decimalPoint;
      }
      ++begin;
    }
  }
}